

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O0

void __thiscall
qpdf::pl::Count::Count
          (Count *this,unsigned_long id,string *str,
          unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link)

{
  bool bVar1;
  pointer pLVar2;
  Pipeline *local_48;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link_local;
  string *str_local;
  unsigned_long id_local;
  Count *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)link);
  if (bVar1) {
    pLVar2 = std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::operator->(link)
    ;
    local_48 = std::unique_ptr<Pipeline,_std::default_delete<Pipeline>_>::get(&pLVar2->next_pl);
  }
  else {
    local_48 = (Pipeline *)0x0;
  }
  Pipeline::Pipeline(&this->super_Pipeline,"",local_48);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_0058f178;
  this->count = 0;
  this->str = str;
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::unique_ptr
            (&this->link,link);
  this->id_ = id;
  this->pass_immediately_to_next = false;
  return;
}

Assistant:

Count(unsigned long id, std::string& str, std::unique_ptr<Link> link = nullptr) :
            Pipeline("", link ? link->next_pl.get() : nullptr),
            str(&str),
            link(std::move(link)),
            id_(id)
        {
        }